

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

Abc_Cex_t *
Bmc_CexCareMinimizeAig
          (Gia_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int nTryCexes,int fCheck,int fVerbose)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *vPriosIn;
  int *piVar4;
  Vec_Int_t *vPriosFf;
  Abc_Cex_t *pAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  Abc_Cex_t **p_00;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  Abc_Cex_t *pCexMin [4];
  int local_78;
  Abc_Cex_t *local_58 [5];
  
  local_58[2] = (Abc_Cex_t *)0x0;
  local_58[3] = (Abc_Cex_t *)0x0;
  local_58[0] = (Abc_Cex_t *)0x0;
  local_58[1] = (Abc_Cex_t *)0x0;
  iVar7 = p->nRegs;
  if (pCex->nPis == p->vCis->nSize - iVar7) {
    if (pCex->nRegs == iVar7) {
      if ((-1 < pCex->iPo) && (pCex->iPo < p->vCos->nSize - iVar7)) {
        if (fVerbose != 0) {
          printf("Original :    ");
          Bmc_CexPrint(pCex,nRealPis,0);
        }
        iVar15 = pCex->iFrame + 1;
        iVar7 = pCex->nPis * iVar15;
        vPriosIn = (Vec_Int_t *)malloc(0x10);
        if (iVar7 - 1U < 0xf) {
          iVar7 = 0x10;
        }
        vPriosIn->nSize = 0;
        vPriosIn->nCap = iVar7;
        if (iVar7 == 0) {
          piVar4 = (int *)0x0;
        }
        else {
          piVar4 = (int *)malloc((long)iVar7 << 2);
        }
        vPriosIn->pArray = piVar4;
        iVar15 = iVar15 * pCex->nRegs;
        vPriosFf = (Vec_Int_t *)malloc(0x10);
        if (iVar15 - 1U < 0xf) {
          iVar15 = 0x10;
        }
        vPriosFf->nSize = 0;
        vPriosFf->nCap = iVar15;
        if (iVar15 == 0) {
          piVar4 = (int *)0x0;
        }
        else {
          piVar4 = (int *)malloc((long)iVar15 << 2);
        }
        vPriosFf->pArray = piVar4;
        uVar17 = (ulong)(uint)nTryCexes;
        if (0 < nTryCexes) {
          local_78 = vPriosIn->nCap;
          uVar8 = 0;
          do {
            uVar16 = ((long)pCex->iFrame + 1) * (long)pCex->nPis;
            iVar7 = (int)uVar16;
            if (local_78 < iVar7) {
              if (vPriosIn->pArray == (int *)0x0) {
                piVar4 = (int *)malloc(uVar16 * 4);
              }
              else {
                piVar4 = (int *)realloc(vPriosIn->pArray,uVar16 * 4);
              }
              vPriosIn->pArray = piVar4;
              if (piVar4 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              vPriosIn->nCap = iVar7;
              local_78 = iVar7;
            }
            if (0 < iVar7) {
              memset(vPriosIn->pArray,0,(uVar16 & 0xffffffff) << 2);
            }
            vPriosIn->nSize = iVar7;
            if (uVar8 == 0) {
              if (pCex->iFrame < 0) {
                iVar15 = 0;
              }
              else {
                pVVar1 = p->vCis;
                iVar15 = 0;
                iVar6 = pCex->iFrame;
                do {
                  iVar9 = pVVar1->nSize;
                  iVar3 = iVar15;
                  if (nRealPis < iVar9 - p->nRegs) {
                    iVar11 = iVar15 * 2;
                    iVar9 = ~p->nRegs + iVar9;
                    do {
                      if (iVar15 < 0) goto LAB_00579495;
                      iVar13 = pCex->nPis * iVar6;
                      uVar12 = iVar9 + iVar13;
                      if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                      uVar14 = iVar13 + pCex->nRegs + iVar9;
                      vPriosIn->pArray[uVar12] =
                           iVar11 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                            (uVar14 & 0x1f) & 1) != 0);
                      iVar11 = iVar11 + 2;
                      iVar3 = iVar3 + 1;
                      bVar2 = nRealPis < iVar9;
                      iVar9 = iVar9 + -1;
                    } while (bVar2);
                  }
                  iVar15 = iVar3;
                  bVar2 = 0 < iVar6;
                  iVar6 = iVar6 + -1;
                } while (bVar2);
              }
              iVar6 = pCex->iFrame;
              if (-1 < pCex->iFrame) {
                do {
                  iVar9 = iVar15;
                  if (0 < nRealPis) {
                    iVar3 = iVar15 * 2;
                    iVar11 = nRealPis + -1;
                    do {
                      if (iVar15 < 0) goto LAB_00579495;
                      iVar13 = pCex->nPis * iVar6;
                      uVar12 = iVar11 + iVar13;
                      if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                      uVar14 = iVar13 + pCex->nRegs + iVar11;
                      vPriosIn->pArray[uVar12] =
                           iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f)
                                          & 1) != 0);
                      iVar3 = iVar3 + 2;
                      iVar13 = iVar11 + 1;
                      iVar9 = iVar9 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar13);
                  }
                  iVar15 = iVar9;
                  bVar2 = 0 < iVar6;
                  iVar6 = iVar6 + -1;
                } while (bVar2);
              }
            }
            else {
              iVar15 = (int)uVar8;
              if (iVar15 == 3) {
                if (pCex->iFrame < 0) {
                  iVar15 = 0;
                }
                else {
                  pVVar1 = p->vCis;
                  iVar15 = 0;
                  iVar6 = pCex->iFrame;
                  do {
                    iVar9 = iVar15;
                    if (nRealPis < pVVar1->nSize - p->nRegs) {
                      iVar3 = iVar15 * 2;
                      iVar11 = nRealPis;
                      do {
                        if (iVar15 < 0) goto LAB_00579495;
                        iVar13 = pCex->nPis * iVar6;
                        uVar12 = iVar11 + iVar13;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                        uVar14 = pCex->nRegs + iVar11 + iVar13;
                        vPriosIn->pArray[uVar12] =
                             iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                             (uVar14 & 0x1f) & 1) != 0);
                        iVar11 = iVar11 + 1;
                        iVar3 = iVar3 + 2;
                        iVar9 = iVar9 + 1;
                      } while (iVar11 < pVVar1->nSize - p->nRegs);
                    }
                    iVar15 = iVar9;
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
                iVar6 = pCex->iFrame;
                if (-1 < pCex->iFrame) {
                  do {
                    if (0 < nRealPis) {
                      iVar9 = iVar15 * 2;
                      iVar3 = 0;
                      do {
                        if (iVar15 < 0) goto LAB_00579495;
                        iVar11 = pCex->nPis * iVar6;
                        uVar12 = iVar3 + iVar11;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                        uVar14 = pCex->nRegs + iVar3 + iVar11;
                        vPriosIn->pArray[uVar12] =
                             iVar9 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                             (uVar14 & 0x1f) & 1) != 0);
                        iVar3 = iVar3 + 1;
                        iVar9 = iVar9 + 2;
                      } while (nRealPis != iVar3);
                      iVar15 = iVar15 + iVar3;
                    }
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
              }
              else if (iVar15 == 2) {
                if (pCex->iFrame < 0) {
                  iVar15 = 0;
                }
                else {
                  pVVar1 = p->vCis;
                  iVar15 = 0;
                  iVar6 = pCex->iFrame;
                  do {
                    iVar9 = iVar15;
                    if (nRealPis < pVVar1->nSize - p->nRegs) {
                      iVar3 = iVar15 * 2;
                      iVar11 = nRealPis;
                      do {
                        if (iVar15 < 0) goto LAB_00579495;
                        iVar13 = pCex->nPis * iVar6;
                        uVar12 = iVar11 + iVar13;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                        uVar14 = pCex->nRegs + iVar11 + iVar13;
                        vPriosIn->pArray[uVar12] =
                             iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                             (uVar14 & 0x1f) & 1) != 0);
                        iVar11 = iVar11 + 1;
                        iVar3 = iVar3 + 2;
                        iVar9 = iVar9 + 1;
                      } while (iVar11 < pVVar1->nSize - p->nRegs);
                    }
                    iVar15 = iVar9;
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
                iVar6 = pCex->iFrame;
                if (-1 < pCex->iFrame) {
                  do {
                    iVar9 = iVar15;
                    if (0 < nRealPis) {
                      iVar3 = iVar15 * 2;
                      iVar11 = nRealPis + -1;
                      do {
                        if (iVar15 < 0) goto LAB_00579495;
                        iVar13 = pCex->nPis * iVar6;
                        uVar12 = iVar11 + iVar13;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                        uVar14 = iVar13 + pCex->nRegs + iVar11;
                        vPriosIn->pArray[uVar12] =
                             iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                             (uVar14 & 0x1f) & 1) != 0);
                        iVar3 = iVar3 + 2;
                        iVar13 = iVar11 + 1;
                        iVar9 = iVar9 + 1;
                        iVar11 = iVar11 + -1;
                      } while (1 < iVar13);
                    }
                    iVar15 = iVar9;
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
              }
              else {
                if (iVar15 != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                                ,0x16c,
                                "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                               );
                }
                if (pCex->iFrame < 0) {
                  iVar15 = 0;
                }
                else {
                  pVVar1 = p->vCis;
                  iVar15 = 0;
                  iVar6 = pCex->iFrame;
                  do {
                    iVar9 = pVVar1->nSize;
                    iVar3 = iVar15;
                    if (nRealPis < iVar9 - p->nRegs) {
                      iVar11 = iVar15 * 2;
                      iVar9 = ~p->nRegs + iVar9;
                      do {
                        if (iVar15 < 0) goto LAB_00579495;
                        iVar13 = pCex->nPis * iVar6;
                        uVar12 = iVar9 + iVar13;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_00579476;
                        uVar14 = iVar13 + pCex->nRegs + iVar9;
                        vPriosIn->pArray[uVar12] =
                             iVar11 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                              (uVar14 & 0x1f) & 1) != 0);
                        iVar11 = iVar11 + 2;
                        iVar3 = iVar3 + 1;
                        bVar2 = nRealPis < iVar9;
                        iVar9 = iVar9 + -1;
                      } while (bVar2);
                    }
                    iVar15 = iVar3;
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
                iVar6 = pCex->iFrame;
                if (-1 < pCex->iFrame) {
                  do {
                    if (0 < nRealPis) {
                      iVar9 = iVar15 * 2;
                      iVar3 = 0;
                      do {
                        if (iVar15 < 0) {
LAB_00579495:
                          __assert_fail("Var >= 0 && !(c >> 1)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                        ,0x12e,"int Abc_Var2Lit(int, int)");
                        }
                        iVar11 = pCex->nPis * iVar6;
                        uVar12 = iVar3 + iVar11;
                        if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) {
LAB_00579476:
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                        }
                        uVar14 = pCex->nRegs + iVar3 + iVar11;
                        vPriosIn->pArray[uVar12] =
                             iVar9 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >>
                                             (uVar14 & 0x1f) & 1) != 0);
                        iVar3 = iVar3 + 1;
                        iVar9 = iVar9 + 2;
                      } while (nRealPis != iVar3);
                      iVar15 = iVar15 + iVar3;
                    }
                    bVar2 = 0 < iVar6;
                    iVar6 = iVar6 + -1;
                  } while (bVar2);
                }
              }
            }
            if (iVar15 != (pCex->iFrame + 1) * pCex->nPis) {
              __assert_fail("Counter == pCex->nPis * (pCex->iFrame + 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                            ,0x16e,
                            "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                           );
            }
            Bmc_CexCarePropagateFwd(p,pCex,vPriosIn,vPriosFf);
            if (vPriosFf->nSize != (pCex->iFrame + 1) * pCex->nRegs) {
              __assert_fail("Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                            ,0x170,
                            "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                           );
            }
            uVar12 = pCex->iPo;
            iVar7 = p->vCos->nSize;
            if (iVar7 - p->nRegs <= (int)uVar12) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar7 = p->vCos->pArray[uVar12];
            if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar12 = p->pObjs[iVar7].Value;
            if ((int)uVar12 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((uVar12 & 1) == 0) {
              puts("Counter-example is invalid.");
              if (vPriosIn->pArray != (int *)0x0) {
                free(vPriosIn->pArray);
                vPriosIn->pArray = (int *)0x0;
              }
              free(vPriosIn);
              if (vPriosFf->pArray != (int *)0x0) {
                free(vPriosFf->pArray);
                vPriosFf->pArray = (int *)0x0;
              }
              free(vPriosFf);
              return (Abc_Cex_t *)0x0;
            }
            pAVar5 = Bmc_CexCarePropagateBwd(p,pCex,vPriosIn,vPriosFf);
            local_58[uVar8] = pAVar5;
            if (fVerbose != 0) {
              pcVar10 = "PI-  PPI-:    ";
              if (uVar8 != 0) {
                if (3 < uVar8) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                                ,0x183,
                                "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                               );
                }
                pcVar10 = &DAT_009f9c00 +
                          *(int *)(&DAT_009f9c00 + ((long)((uVar8 << 0x20) + -0x100000000) >> 0x1e))
                ;
              }
              printf(pcVar10);
              Bmc_CexPrint(local_58[uVar8],nRealPis,0);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar17);
        }
        if (vPriosIn->pArray != (int *)0x0) {
          free(vPriosIn->pArray);
          vPriosIn->pArray = (int *)0x0;
        }
        free(vPriosIn);
        if (vPriosFf->pArray != (int *)0x0) {
          free(vPriosFf->pArray);
          vPriosFf->pArray = (int *)0x0;
        }
        free(vPriosFf);
        pAVar5 = local_58[0];
        iVar7 = Abc_CexCountOnes(local_58[0]);
        if (1 < nTryCexes) {
          uVar8 = 1;
          do {
            if ((local_58[uVar8] != (Abc_Cex_t *)0x0) &&
               (iVar15 = Abc_CexCountOnes(local_58[uVar8]), iVar15 < iVar7)) {
              pAVar5 = local_58[uVar8];
              iVar7 = iVar15;
            }
            uVar8 = uVar8 + 1;
          } while (uVar17 != uVar8);
        }
        if (fVerbose != 0) {
          printf("Final    :    ");
          Bmc_CexPrint(pAVar5,nRealPis,0);
        }
        if (0 < nTryCexes) {
          p_00 = local_58;
          do {
            if ((*p_00 != (Abc_Cex_t *)0x0) && (pAVar5 != *p_00)) {
              Abc_CexFreeP(p_00);
            }
            p_00 = p_00 + 1;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        iVar7 = Bmc_CexVerify(p,pCex,pAVar5);
        if (iVar7 == 0) {
          pcVar10 = "Counter-example verification has failed.";
        }
        else {
          if (fCheck == 0) {
            return pAVar5;
          }
          pcVar10 = "Counter-example verification succeeded.";
        }
        puts(pcVar10);
        return pAVar5;
      }
      pcVar10 = "Given CEX has PO whose index is out of range for the AIG.";
    }
    else {
      pcVar10 = "Given CEX does to have same number of flops as the AIG.";
    }
  }
  else {
    pcVar10 = "Given CEX does to have same number of inputs as the AIG.";
  }
  puts(pcVar10);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Bmc_CexCareMinimizeAig( Gia_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int nTryCexes, int fCheck, int fVerbose )
{
    //int nTryCexes = 4; // belongs to range [1;4]
    Abc_Cex_t * pCexBest, * pCexMin[4] = {NULL};
    int k, f, i, nOnesBest, nOnesCur, Counter = 0;
    Vec_Int_t * vPriosIn, * vPriosFf;
    if ( pCex->nPis != Gia_ManPiNum(p) )
    {
        printf( "Given CEX does to have same number of inputs as the AIG.\n" );
        return NULL;
    }
    if ( pCex->nRegs != Gia_ManRegNum(p) )
    {
        printf( "Given CEX does to have same number of flops as the AIG.\n" );
        return NULL;
    }
    if ( !(pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p)) )
    {
        printf( "Given CEX has PO whose index is out of range for the AIG.\n" );
        return NULL;
    }
    assert( pCex->nPis == Gia_ManPiNum(p) );
    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p) );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, nRealPis, 0 );
    }
    vPriosIn = Vec_IntAlloc( pCex->nPis  * (pCex->iFrame + 1) );
    vPriosFf = Vec_IntAlloc( pCex->nRegs * (pCex->iFrame + 1) );
    for ( k = 0; k < nTryCexes; k++ )
    {
        Counter = 0;
        Vec_IntFill( vPriosIn, pCex->nPis * (pCex->iFrame + 1), 0 );
/*
        if ( k == 0 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );
*/
        if ( k == 0 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );

        assert( Counter == pCex->nPis * (pCex->iFrame + 1) );
        Bmc_CexCarePropagateFwd( p, pCex, vPriosIn, vPriosFf );
        assert( Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1) );
        if ( !Abc_LitIsCompl(Gia_ManPo(p, pCex->iPo)->Value) )
        {
            printf( "Counter-example is invalid.\n" );
            Vec_IntFree( vPriosIn );
            Vec_IntFree( vPriosFf );
            return NULL;
        }
        pCexMin[k] = Bmc_CexCarePropagateBwd( p, pCex, vPriosIn, vPriosFf );
        if ( fVerbose )
        {
            if ( k == 0 )
                printf( "PI-  PPI-:    " );
            else if ( k == 1 )
                printf( "PI+  PPI-:    " );
            else if ( k == 2 )
                printf( "PI-  PPI+:    " );
            else if ( k == 3 )
                printf( "PI+  PPI+:    " );
            else assert( 0 );
            Bmc_CexPrint( pCexMin[k], nRealPis, 0 );
        }
    }
    Vec_IntFree( vPriosIn );
    Vec_IntFree( vPriosFf );
    // select the best one
    pCexBest  = pCexMin[0];
    nOnesBest = Abc_CexCountOnes(pCexMin[0]);
    for ( k = 1; k < nTryCexes; k++ )
    {
        if ( pCexMin[k] == NULL )
            continue;
        nOnesCur = Abc_CexCountOnes(pCexMin[k]);
        if ( nOnesBest > nOnesCur )
        {
            nOnesBest = nOnesCur;
            pCexBest  = pCexMin[k];
        }
    }
    if ( fVerbose )
    {
        //Abc_Cex_t * pTotal = Bmc_CexCareTotal( pCexMin, nTryCexes );
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, nRealPis, 0 );
        //printf( "Total    :    " );
        //Bmc_CexPrint( pTotal, nRealPis, 0 );
        //Abc_CexFreeP( &pTotal );
    }
    for ( k = 0; k < nTryCexes; k++ )
        if ( pCexMin[k] && pCexBest != pCexMin[k] )
            Abc_CexFreeP( &pCexMin[k] );
    // verify and return
    if ( !Bmc_CexVerify( p, pCex, pCexBest ) )
        printf( "Counter-example verification has failed.\n" );
    else if ( fCheck ) 
        printf( "Counter-example verification succeeded.\n" );
    return pCexBest;
}